

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genDynamicSetVariable(InstructionGenerator *this)

{
  Instruction local_6c;
  undefined1 local_68 [48];
  undefined1 local_38 [48];
  
  local_6c = DYNAMIC_SET_VARIABLE;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_6c);
  VirtualStack::pop((Variable *)local_38,&this->super_VirtualStack);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  VirtualStack::pop((Variable *)local_68,&this->super_VirtualStack);
  std::__cxx11::string::~string((string *)(local_68 + 8));
  return;
}

Assistant:

void InstructionGenerator::genDynamicSetVariable()
{
    bytecode->emplace_back(Instruction::DYNAMIC_SET_VARIABLE);
    pop();
    pop();
}